

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void StripWhiteSpace(string *str)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  pointer pcVar6;
  uint uVar7;
  size_type sVar8;
  size_type sVar9;
  
  sVar8 = str->_M_string_length;
  uVar7 = (uint)sVar8;
  if ((int)uVar7 < 1) {
    if (uVar7 != 0) {
      return;
    }
  }
  else {
    sVar9 = 0;
    do {
      if (sVar8 == sVar9) goto LAB_00108308;
      iVar3 = isspace((int)(str->_M_dataplus)._M_p[sVar9]);
      if (iVar3 == 0) {
        if (uVar7 != (uint)sVar9) {
          if (sVar9 != 0) {
            std::__cxx11::string::erase((ulong)str,0);
            sVar8 = (size_type)(uVar7 - (uint)sVar9);
          }
          if ((int)sVar8 < 1) {
            return;
          }
          uVar1 = str->_M_string_length;
          lVar5 = -(sVar8 & 0xffffffff);
          iVar3 = 0;
          goto LAB_001082c4;
        }
        break;
      }
      sVar9 = sVar9 + 1;
    } while ((uVar7 & 0x7fffffff) != sVar9);
  }
  str->_M_string_length = 0;
  pcVar6 = (str->_M_dataplus)._M_p;
LAB_0010828a:
  *pcVar6 = '\0';
  return;
LAB_001082c4:
  iVar2 = (int)sVar8;
  if (uVar1 <= iVar2 - 1) {
LAB_00108308:
    do {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    } while( true );
  }
  pcVar6 = (str->_M_dataplus)._M_p;
  iVar4 = isspace((int)pcVar6[iVar2 - 1]);
  if (iVar4 == 0) {
    if (iVar3 == 0) {
      return;
    }
    pcVar6 = pcVar6 + -lVar5;
    str->_M_string_length = -lVar5;
    goto LAB_0010828a;
  }
  lVar5 = lVar5 + 1;
  iVar3 = iVar3 + 1;
  sVar8 = (size_type)(iVar2 - 1U);
  if (iVar2 - 1U == 0 || iVar2 < 1) {
    return;
  }
  goto LAB_001082c4;
}

Assistant:

inline void StripWhiteSpace(std::string* str) {
  int str_length = str->length();

  // Strip off leading whitespace.
  int first = 0;
  while (first < str_length && isspace(str->at(first))) {
    ++first;
  }
  // If entire string is white space.
  if (first == str_length) {
    str->clear();
    return;
  }
  if (first > 0) {
    str->erase(0, first);
    str_length -= first;
  }

  // Strip off trailing whitespace.
  int last = str_length - 1;
  while (last >= 0 && isspace(str->at(last))) {
    --last;
  }
  if (last != (str_length - 1) && last >= 0) {
    str->erase(last + 1, std::string::npos);
  }
}